

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

OnCallSpec<test_result_(unsigned_long_long)> * __thiscall
testing::internal::FunctionMockerBase<test_result_(unsigned_long_long)>::AddNewOnCallSpec
          (FunctionMockerBase<test_result_(unsigned_long_long)> *this,char *file,int line,
          ArgumentMatcherTuple *m)

{
  pointer *pppvVar1;
  iterator __position;
  void *mock_obj;
  OnCallSpec<test_result_(unsigned_long_long)> *this_00;
  OnCallSpec<test_result_(unsigned_long_long)> *local_30;
  
  mock_obj = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
  Mock::RegisterUseByOnCallOrExpectCall(mock_obj,file,line);
  this_00 = (OnCallSpec<test_result_(unsigned_long_long)> *)operator_new(0x50);
  OnCallSpec<test_result_(unsigned_long_long)>::OnCallSpec(this_00,file,line,m);
  __position._M_current =
       (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
       super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_30 = this_00;
    std::vector<void_const*,std::allocator<void_const*>>::_M_realloc_insert<void_const*>
              ((vector<void_const*,std::allocator<void_const*>> *)
               &(this->super_UntypedFunctionMockerBase).untyped_on_call_specs_,__position,&local_30)
    ;
  }
  else {
    *__position._M_current = this_00;
    pppvVar1 = &(this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  return this_00;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    Mock::RegisterUseByOnCallOrExpectCall(MockObject(), file, line);
    OnCallSpec<F>* const on_call_spec = new OnCallSpec<F>(file, line, m);
    untyped_on_call_specs_.push_back(on_call_spec);
    return *on_call_spec;
  }